

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  node234_conflict *pnVar1;
  tree234 *ptr;
  int iVar2;
  int count;
  int count_1;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int in [60];
  int aiStack_128 [62];
  
  if (1 < argc) {
    uVar7 = 1;
    do {
      __s1 = argv[uVar7];
      iVar2 = strcmp(__s1,"-v");
      if (iVar2 != 0) {
        fprintf(_stderr,"unrecognised option \'%s\'\n",__s1);
        return 1;
      }
      verbose = verbose + 1;
      uVar7 = uVar7 + 1;
    } while ((uint)argc != uVar7);
  }
  memset(aiStack_128,0,0xf0);
  array = (void **)0x0;
  arraysize = 0;
  arraylen = 0;
  tree = newtree234(mycmp);
  cmp = mycmp;
  verify();
  searchtest();
  uVar7 = 0;
  uVar6 = 0;
  do {
    if (verbose != 0) {
      printf("trial: %d\n",uVar7);
    }
    uVar6 = uVar6 * 0x41c64e6d + 0x3039;
    uVar3 = (uVar6 >> 0x10 & 0x7fff) % 0x3c;
    if (aiStack_128[uVar3] == 0) {
      if (verbose != 0) {
        printf("adding %s (%d)\n",strings[uVar3]);
      }
      addtest(strings[uVar3]);
      iVar2 = 1;
    }
    else {
      if (verbose != 0) {
        printf("deleting %s (%d)\n",strings[uVar3]);
      }
      deltest(strings[uVar3]);
      iVar2 = 0;
    }
    aiStack_128[uVar3] = iVar2;
    findtest();
    searchtest();
    uVar3 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar3;
  } while (uVar3 != 10000);
  while (ptr = tree, 0 < arraylen) {
    uVar6 = uVar6 * 0x41c64e6d + 0x3039;
    deltest(array[(ulong)(uVar6 >> 0x10 & 0x7fff) % (ulong)(uint)arraylen]);
  }
  freenode234(tree->root);
  safefree(ptr);
  tree = newtree234((cmpfn234)0x0);
  cmp = (cmpfn234)0x0;
  verify();
  uVar3 = 0;
  do {
    if (verbose != 0) {
      printf("trial: %d\n",(ulong)uVar3);
    }
    pnVar1 = tree->root;
    if (pnVar1 == (node234_conflict *)0x0) {
      iVar2 = 1;
    }
    else {
      lVar4 = 0;
      iVar2 = 0;
      do {
        iVar2 = iVar2 + pnVar1->counts[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      lVar4 = 0;
      do {
        iVar2 = (iVar2 + 1) - (uint)(pnVar1->elems[lVar4] == (void *)0x0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      iVar2 = iVar2 + 1;
    }
    uVar5 = (uVar6 * 0x41c64e6d + 0x3039 >> 0x10 & 0x7fff) % 0x3c;
    uVar6 = uVar6 * -0x3d5d6597 + 0xd3dc167e;
    uVar7 = (long)(ulong)(uVar6 >> 0x10 & 0x7fff) % (long)iVar2;
    if (verbose != 0) {
      printf("adding string %s at index %d\n",strings[uVar5],uVar7 & 0xffffffff);
    }
    addpostest(strings[uVar5],(int)uVar7);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 1000);
  pnVar1 = tree->root;
  while (pnVar1 != (node234_conflict *)0x0) {
    lVar4 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + pnVar1->counts[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar4 = 0;
    do {
      iVar2 = (iVar2 + 1) - (uint)(pnVar1->elems[lVar4] == (void *)0x0);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if (iVar2 < 1) break;
    if (verbose != 0) {
      if (pnVar1 != (node234_conflict *)0x0) {
        lVar4 = 0;
        do {
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        lVar4 = 0;
        do {
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
      }
      printf("cleanup: tree size %d\n");
    }
    pnVar1 = tree->root;
    if (pnVar1 == (node234_conflict *)0x0) {
      iVar2 = 0;
    }
    else {
      lVar4 = 0;
      iVar2 = 0;
      do {
        iVar2 = iVar2 + pnVar1->counts[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      lVar4 = 0;
      do {
        iVar2 = (iVar2 + 1) - (uint)(pnVar1->elems[lVar4] == (void *)0x0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
    uVar6 = uVar6 * 0x41c64e6d + 0x3039;
    uVar7 = (long)(ulong)(uVar6 >> 0x10 & 0x7fff) % (long)iVar2;
    if (verbose != 0) {
      printf("deleting string %s from index %d\n",array[uVar7 & 0xffffffff],uVar7 & 0xffffffff);
    }
    delpostest((int)uVar7);
    pnVar1 = tree->root;
  }
  printf("%d errors found\n",(ulong)(uint)n_errors);
  return (uint)(n_errors != 0);
}

Assistant:

int main(int argc, char **argv)
{
    int in[NSTR];
    int i, j, k;
    unsigned seed = 0;

    for (i = 1; i < argc; i++) {
        char *arg = argv[i];
        if (!strcmp(arg, "-v")) {
            verbose++;
        } else {
            fprintf(stderr, "unrecognised option '%s'\n", arg);
            return 1;
        }
    }

    for (i = 0; i < NSTR; i++)
        in[i] = 0;
    array = NULL;
    arraylen = arraysize = 0;
    tree = newtree234(mycmp);
    cmp = mycmp;

    verify();
    searchtest();
    for (i = 0; i < 10000; i++) {
        j = randomnumber(&seed);
        j %= NSTR;
        if (verbose)
            printf("trial: %d\n", i);
        if (in[j]) {
            if (verbose)
                printf("deleting %s (%d)\n", strings[j], j);
            deltest(strings[j]);
            in[j] = 0;
        } else {
            if (verbose)
                printf("adding %s (%d)\n", strings[j], j);
            addtest(strings[j]);
            in[j] = 1;
        }
        findtest();
        searchtest();
    }

    while (arraylen > 0) {
        j = randomnumber(&seed);
        j %= arraylen;
        deltest(array[j]);
    }

    freetree234(tree);

    /*
     * Now try an unsorted tree. We don't really need to test
     * delpos234 because we know del234 is based on it, so it's
     * already been tested in the above sorted-tree code; but for
     * completeness we'll use it to tear down our unsorted tree
     * once we've built it.
     */
    tree = newtree234(NULL);
    cmp = NULL;
    verify();
    for (i = 0; i < 1000; i++) {
        if (verbose)
            printf("trial: %d\n", i);
        j = randomnumber(&seed);
        j %= NSTR;
        k = randomnumber(&seed);
        k %= count234(tree) + 1;
        if (verbose)
            printf("adding string %s at index %d\n", strings[j], k);
        addpostest(strings[j], k);
    }
    while (count234(tree) > 0) {
        if (verbose)
            printf("cleanup: tree size %d\n", count234(tree));
        j = randomnumber(&seed);
        j %= count234(tree);
        if (verbose)
            printf("deleting string %s from index %d\n",
                   (const char *)array[j], j);
        delpostest(j);
    }

    printf("%d errors found\n", n_errors);
    return (n_errors != 0);
}